

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_enableSimplifierAndScaler
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Settings *pSVar1;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  cpp_dec_float<200U,_int,_void> *this_00;
  Real val;
  cpp_dec_float<200U,_int,_void> cStack_118;
  cpp_dec_float<200U,_int,_void> local_98;
  
  this_00 = &cStack_118;
  pSVar1 = this->_currentSettings;
  switch(pSVar1->_intParamValues[10]) {
  case 0:
    this->_simplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    break;
  case 1:
  case 3:
    this->_simplifier =
         &(this->_simplifierMainSM).
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    val = pSVar1->_realParamValues[0x12];
    this_00 = &local_98;
    goto LAB_0046165b;
  case 2:
    this->_simplifier =
         &(this->_simplifierMainSM).
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    val = pSVar1->_realParamValues[0x12];
LAB_0046165b:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (this_00,val,(type *)0x0);
    (*(this->_simplifierMainSM).
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ._vptr_SPxSimplifier[0x12])(&this->_simplifierMainSM,this_00);
  }
  switch(this->_currentSettings->_intParamValues[0xb]) {
  case 0:
    pSVar2 = (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
    break;
  case 1:
    pSVar2 = &(this->_scalerUniequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 2:
    pSVar2 = &(this->_scalerBiequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 3:
    pSVar2 = &(this->_scalerGeo1).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 4:
    pSVar2 = &(this->_scalerGeo8).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 5:
    pSVar2 = &(this->_scalerLeastsq).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 6:
    pSVar2 = &(this->_scalerGeoequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  default:
    goto switchD_00461693_default;
  }
  this->_scaler = pSVar2;
switchD_00461693_default:
  return;
}

Assistant:

void SoPlexBase<R>::_enableSimplifierAndScaler()
{
   // type of simplifier
   switch(intParam(SoPlexBase<R>::SIMPLIFIER))
   {
   case SIMPLIFIER_OFF:
      _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = nullptr;
#endif
      break;

   case SIMPLIFIER_AUTO:
   case SIMPLIFIER_INTERNAL:
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif
      break;

   case SIMPLIFIER_PAPILO:
#ifdef SOPLEX_WITH_PAPILO
      _simplifier = &_simplifierPaPILO;
      assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierPaPILO;
      assert(_boostedSimplifier != nullptr);
#endif
#else
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif // !SOPLEX_WITH_MPFR
#endif // SOPLEX_WITH_PAPILO
      break;

   default:
      break;
   }

   // type of scaler
   switch(intParam(SoPlexBase<R>::SCALER))
   {
   case SCALER_OFF:
      _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif
      break;

   case SCALER_UNIEQUI:
      _scaler = &_scalerUniequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerUniequi;
#endif
      break;

   case SCALER_BIEQUI:
      _scaler = &_scalerBiequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerBiequi;
#endif
      break;

   case SCALER_GEO1:
      _scaler = &_scalerGeo1;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo1;
#endif
      break;

   case SCALER_GEO8:
      _scaler = &_scalerGeo8;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo8;
#endif
      break;

   case SCALER_LEASTSQ:
      _scaler = &_scalerLeastsq;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerLeastsq;
#endif
      break;

   case SCALER_GEOEQUI:
      _scaler = &_scalerGeoequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeoequi;
#endif
      break;

   default:
      break;
   }
}